

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  bool bVar2;
  iterator __position;
  iterator iVar3;
  iterator iVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char *pcVar13;
  ostream *poVar14;
  size_t sVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  PolicyID id;
  cmExpandedCommandArgument *pcVar17;
  byte bVar18;
  cmConditionEvaluator *pcVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  cmMakefile *pcVar21;
  bool bVar22;
  iterator argP2;
  iterator argP1;
  iterator arg;
  int reducible;
  char *def;
  string def_buf;
  double rhs;
  ostringstream error;
  RegularExpression regEntry;
  iterator local_4d8;
  char local_4c9;
  iterator local_4c8;
  iterator local_4c0;
  cmConditionEvaluator *local_4b8;
  int local_4b0;
  byte local_4a9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a0;
  char *local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  long *local_480;
  long local_478;
  long local_470 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_270;
  ios_base local_220 [264];
  string *local_118;
  MessageType *local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [10];
  char *local_50;
  
  local_4a0 = &local_490;
  local_498 = (char *)0x0;
  local_490._M_local_buf[0] = '\0';
  local_450 = &local_3f0.field_2;
  local_438 = &local_370.field_2;
  local_458 = &local_410.field_2;
  local_440 = &local_390.field_2;
  local_460 = &local_420;
  local_448 = &local_3b0.field_2;
  local_4b8 = this;
  bVar5 = local_4a9;
  local_118 = errorString;
  local_110 = status;
  do {
    local_4a9 = bVar5;
    local_4b0 = 0;
    local_4c0._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_4c8._M_node = (_List_node_base *)0x0;
    local_4d8._M_node = (_List_node_base *)0x0;
    bVar5 = local_4a9;
    for (; local_4a9 = local_4c0._M_node == (_List_node_base *)newArgs, !(bool)local_4a9;
        local_4c0._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_4c0._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_4c8._M_node = local_4c0._M_node;
      if ((local_4c0._M_node != (_List_node_base *)newArgs) &&
         (local_4c8._M_node = (local_4c0._M_node)->_M_next, local_4d8._M_node = local_4c8._M_node,
         local_4c8._M_node != (_List_node_base *)newArgs)) {
        local_4d8._M_node = (local_4c8._M_node)->_M_next;
      }
      iVar3._M_node = local_4c8._M_node;
      if (local_4d8._M_node == (_List_node_base *)newArgs ||
          local_4c8._M_node == (_List_node_base *)newArgs) {
        bVar6 = false;
      }
      else {
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"MATCHES","");
        bVar6 = IsKeyword(this,&local_350,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4._M_node = local_4c0._M_node;
      if (bVar6 != false) {
        pcVar17 = (cmExpandedCommandArgument *)(local_4c0._M_node + 1);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)GetDefinitionIfUnquoted(this,pcVar17);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar17->Value)._M_dataplus._M_p;
        if (paVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar11 = paVar20;
        }
        local_4a8 = paVar11;
        if ((paVar11 != paVar20) &&
           (iVar9 = strncmp(paVar20->_M_local_buf,"CMAKE_MATCH_",0xc), pcVar13 = local_498,
           iVar9 == 0)) {
          strlen(paVar11->_M_local_buf);
          std::__cxx11::string::_M_replace((ulong)&local_4a0,0,pcVar13,(ulong)paVar11);
          local_4a8 = local_4a0;
        }
        __position._M_node = local_4d8._M_node;
        p_Var1 = local_4d8._M_node[1]._M_next;
        cmMakefile::ClearMatches(local_4b8->Makefile);
        local_50 = (char *)0x0;
        local_4c9 = cmsys::RegularExpression::compile((RegularExpression *)local_108,(char *)p_Var1)
        ;
        if ((bool)local_4c9) {
          bVar6 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_108,local_4a8->_M_local_buf);
          if (bVar6) {
            cmMakefile::StoreMatches(local_4b8->Makefile,(RegularExpression *)local_108);
            local_480 = local_470;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"1","");
            local_290._0_8_ = &local_280;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_290,local_480,local_478 + (long)local_480);
          }
          else {
            local_480 = local_470;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"0","");
            local_290._0_8_ = &local_280;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_290,local_480,local_478 + (long)local_480);
          }
          local_270 = 1;
          std::__cxx11::string::operator=((string *)pcVar17,(string *)local_290);
          *(undefined1 *)&iVar4._M_node[3]._M_next = local_270;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._0_8_ != &local_280) {
            operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
          }
          this = local_4b8;
          if (local_480 != local_470) {
            operator_delete(local_480,local_470[0] + 1);
          }
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,__position);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,iVar3);
          local_4c8._M_node = local_4c0._M_node;
          if ((local_4c0._M_node != (_List_node_base *)newArgs) &&
             (local_4c8._M_node =
                   (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)&(local_4c0._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base.
                   _M_next, local_4d8._M_node = local_4c8._M_node,
             local_4c8._M_node != (_List_node_base *)newArgs)) {
            local_4d8._M_node = (local_4c8._M_node)->_M_next;
          }
          local_4b0 = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"Regular expression \"",0x14);
          this = local_4b8;
          if (p_Var1 == (_List_node_base *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffb18 +
                            (int)*(undefined8 *)(local_290._0_8_ + -0x18) + 600);
          }
          else {
            sVar15 = strlen((char *)p_Var1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,(char *)p_Var1,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"\" cannot compile",0x10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_118,(string *)&local_480);
          if (local_480 != local_470) {
            operator_delete(local_480,local_470[0] + 1);
          }
          *local_110 = FATAL_ERROR;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
        }
        if (local_50 != (char *)0x0) {
          operator_delete__(local_50);
        }
        bVar5 = local_4a9;
        bVar18 = local_4a9;
        if (local_4c9 == '\0') goto LAB_0026f9b3;
      }
      iVar3._M_node = local_4c8._M_node;
      if (local_4c8._M_node == (_List_node_base *)newArgs) {
        bVar6 = false;
      }
      else {
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"MATCHES","");
        bVar6 = IsKeyword(this,&local_3d0,(cmExpandedCommandArgument *)(local_4c0._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar6 != false) {
        local_108 = (undefined1  [8])local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"0","");
        local_290._0_8_ = &local_280;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_290,local_108,
                   (char *)((long)local_108 + (long)&pbStack_100->_M_dataplus));
        iVar4._M_node = local_4c0._M_node;
        local_270 = 1;
        std::__cxx11::string::operator=((string *)(local_4c0._M_node + 1),(string *)local_290);
        *(undefined1 *)&iVar4._M_node[3]._M_next = local_270;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._0_8_ != &local_280) {
          operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
        }
        this = local_4b8;
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,(ulong)(local_f8[0]._M_allocated_capacity + 1));
        }
        std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        _M_erase(newArgs,iVar3);
        local_4c8._M_node = local_4c0._M_node;
        if ((local_4c0._M_node != (_List_node_base *)newArgs) &&
           (local_4c8._M_node = (local_4c0._M_node)->_M_next, local_4d8._M_node = local_4c8._M_node,
           local_4c8._M_node != (_List_node_base *)newArgs)) {
          local_4d8._M_node = (local_4c8._M_node)->_M_next;
        }
        local_4b0 = 1;
      }
      iVar3._M_node = local_4c8._M_node;
      bVar6 = local_4c8._M_node == (_List_node_base *)newArgs;
      bVar22 = local_4d8._M_node == (_List_node_base *)newArgs;
      if (bVar22 || bVar6) {
        bVar2 = false;
        bVar7 = false;
        bVar8 = false;
      }
      else {
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"LESS","");
        pcVar17 = (cmExpandedCommandArgument *)(iVar3._M_node + 1);
        bVar7 = IsKeyword(this,&local_3f0,pcVar17);
        if (bVar7) {
          bVar8 = true;
          bVar2 = false;
          bVar7 = false;
        }
        else {
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"GREATER","");
          bVar7 = IsKeyword(this,&local_370,pcVar17);
          if (bVar7) {
            bVar2 = true;
            bVar7 = false;
            bVar8 = true;
          }
          else {
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"EQUAL","");
            bVar8 = IsKeyword(this,&local_2b0,pcVar17);
            bVar2 = true;
            bVar7 = true;
          }
        }
      }
      if ((bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      pcVar19 = local_4b8;
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2)) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar22 && !bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2)) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if (bVar8 != false) {
        pcVar17 = (cmExpandedCommandArgument *)(local_4c0._M_node + 1);
        local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)GetDefinitionIfUnquoted(pcVar19,pcVar17);
        if (local_4a8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pcVar17->Value)._M_dataplus._M_p;
        }
        pcVar17 = (cmExpandedCommandArgument *)(local_4d8._M_node + 1);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)GetDefinitionIfUnquoted(local_4b8,pcVar17);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar17->Value)._M_dataplus._M_p;
        bVar6 = false;
        paVar11 = local_4a8;
        iVar9 = __isoc99_sscanf(local_4a8,"%lg",local_108);
        if (iVar9 == 1) {
          paVar11 = paVar20;
          if (paVar12 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            paVar11 = paVar12;
          }
          bVar6 = false;
          iVar9 = __isoc99_sscanf(paVar11,"%lg",&local_480);
          if (iVar9 == 1) {
            local_290._0_8_ = &local_280;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"LESS","");
            p_Var1 = iVar3._M_node[1]._M_prev;
            if (p_Var1 == (_List_node_base *)local_290._8_8_) {
              if (p_Var1 == (_List_node_base *)0x0) {
                bVar6 = true;
              }
              else {
                iVar9 = bcmp(iVar3._M_node[1]._M_next,(void *)local_290._0_8_,(size_t)p_Var1);
                bVar6 = iVar9 == 0;
              }
            }
            else {
              bVar6 = false;
            }
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._0_8_ != &local_280) {
              operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
            }
            if (bVar6) {
              bVar6 = (double)local_480 == (double)local_108;
              bVar22 = (double)local_480 < (double)local_108;
            }
            else {
              local_290._0_8_ = &local_280;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"GREATER","");
              p_Var1 = iVar3._M_node[1]._M_prev;
              if (p_Var1 == (_List_node_base *)local_290._8_8_) {
                if (p_Var1 == (_List_node_base *)0x0) {
                  bVar6 = true;
                }
                else {
                  iVar9 = bcmp(iVar3._M_node[1]._M_next,(void *)local_290._0_8_,(size_t)p_Var1);
                  bVar6 = iVar9 == 0;
                }
              }
              else {
                bVar6 = false;
              }
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._0_8_ != &local_280) {
                operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
              }
              if (!bVar6) {
                bVar6 = (bool)(-((double)local_108 == (double)local_480) & 1);
                goto LAB_0026ef49;
              }
              bVar6 = (double)local_108 == (double)local_480;
              bVar22 = (double)local_108 < (double)local_480;
            }
            bVar6 = !bVar22 && !bVar6;
          }
        }
LAB_0026ef49:
        HandleBinaryOp((cmConditionEvaluator *)paVar11,bVar6,&local_4b0,&local_4c0,newArgs,
                       &local_4c8,&local_4d8);
      }
      iVar3._M_node = local_4c8._M_node;
      bVar6 = local_4c8._M_node == (_List_node_base *)newArgs;
      bVar22 = local_4d8._M_node == (_List_node_base *)newArgs;
      if (bVar22 || bVar6) {
        bVar2 = false;
        bVar7 = false;
        bVar8 = false;
      }
      else {
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"STRLESS","");
        pcVar17 = (cmExpandedCommandArgument *)(iVar3._M_node + 1);
        bVar7 = IsKeyword(local_4b8,&local_410,pcVar17);
        if (bVar7) {
          bVar8 = true;
          bVar2 = false;
          bVar7 = false;
        }
        else {
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"STREQUAL","");
          bVar7 = IsKeyword(local_4b8,&local_390,pcVar17);
          if (bVar7) {
            bVar2 = true;
            bVar7 = false;
            bVar8 = true;
          }
          else {
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"STRGREATER","");
            bVar8 = IsKeyword(local_4b8,&local_2d0,pcVar17);
            bVar2 = true;
            bVar7 = true;
          }
        }
      }
      if ((bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2)) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2)) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar22 && !bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2)) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      if (bVar8 != false) {
        pcVar17 = (cmExpandedCommandArgument *)(local_4c0._M_node + 1);
        local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)GetDefinitionIfUnquoted(local_4b8,pcVar17);
        if (local_4a8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pcVar17->Value)._M_dataplus._M_p;
        }
        pcVar17 = (cmExpandedCommandArgument *)(local_4d8._M_node + 1);
        pcVar13 = GetDefinitionIfUnquoted(local_4b8,pcVar17);
        if (pcVar13 == (char *)0x0) {
          pcVar13 = (pcVar17->Value)._M_dataplus._M_p;
        }
        iVar9 = strcmp(local_4a8->_M_local_buf,pcVar13);
        local_290._0_8_ = &local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"STRLESS","");
        p_Var1 = iVar3._M_node[1]._M_prev;
        if (p_Var1 == (_List_node_base *)local_290._8_8_) {
          if (p_Var1 == (_List_node_base *)0x0) {
            bVar6 = true;
          }
          else {
            iVar10 = bcmp(iVar3._M_node[1]._M_next,(void *)local_290._0_8_,(size_t)p_Var1);
            bVar6 = iVar10 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._0_8_ != &local_280) {
          operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
        }
        if (bVar6) {
          bVar6 = SUB41((uint)iVar9 >> 0x1f,0);
        }
        else {
          local_290._0_8_ = &local_280;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"STRGREATER","");
          p_Var1 = iVar3._M_node[1]._M_prev;
          if (p_Var1 == (_List_node_base *)local_290._8_8_) {
            if (p_Var1 == (_List_node_base *)0x0) {
              bVar6 = true;
            }
            else {
              iVar10 = bcmp(iVar3._M_node[1]._M_next,(void *)local_290._0_8_,(size_t)p_Var1);
              bVar6 = iVar10 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._0_8_ != &local_280) {
            operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
          }
          if (bVar6) {
            bVar6 = 0 < iVar9;
          }
          else {
            bVar6 = iVar9 == 0;
          }
        }
        HandleBinaryOp((cmConditionEvaluator *)paVar20,bVar6,&local_4b0,&local_4c0,newArgs,
                       &local_4c8,&local_4d8);
      }
      iVar3._M_node = local_4c8._M_node;
      bVar6 = local_4c8._M_node == (_List_node_base *)newArgs;
      bVar22 = local_4d8._M_node == (_List_node_base *)newArgs;
      if (bVar22 || bVar6) {
        bVar2 = false;
        bVar7 = false;
        bVar8 = false;
      }
      else {
        local_430._M_allocated_capacity = (size_type)&local_420;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"VERSION_LESS","");
        pcVar19 = local_4b8;
        pcVar17 = (cmExpandedCommandArgument *)(iVar3._M_node + 1);
        bVar7 = IsKeyword(local_4b8,(string *)&local_430,pcVar17);
        if (bVar7) {
          bVar8 = true;
          bVar2 = false;
          bVar7 = false;
        }
        else {
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"VERSION_GREATER","")
          ;
          bVar7 = IsKeyword(pcVar19,&local_3b0,pcVar17);
          if (bVar7) {
            bVar2 = true;
            bVar7 = false;
            bVar8 = true;
          }
          else {
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"VERSION_EQUAL","")
            ;
            bVar8 = IsKeyword(pcVar19,&local_2f0,pcVar17);
            bVar2 = true;
            bVar7 = true;
          }
        }
      }
      if ((bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2)) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      this = local_4b8;
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2)) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar22 && !bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_allocated_capacity != &local_420)) {
        operator_delete((void *)local_430._M_allocated_capacity,local_420._M_allocated_capacity + 1)
        ;
      }
      if (bVar8 != false) {
        pcVar17 = (cmExpandedCommandArgument *)(local_4c0._M_node + 1);
        local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)GetDefinitionIfUnquoted(this,pcVar17);
        if (local_4a8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pcVar17->Value)._M_dataplus._M_p;
        }
        pcVar17 = (cmExpandedCommandArgument *)(local_4d8._M_node + 1);
        pcVar13 = GetDefinitionIfUnquoted(local_4b8,pcVar17);
        if (pcVar13 == (char *)0x0) {
          pcVar13 = (pcVar17->Value)._M_dataplus._M_p;
        }
        local_290._0_8_ = &local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"VERSION_LESS","");
        p_Var1 = iVar3._M_node[1]._M_prev;
        if (p_Var1 == (_List_node_base *)local_290._8_8_) {
          if (p_Var1 == (_List_node_base *)0x0) {
            bVar6 = true;
          }
          else {
            iVar9 = bcmp(iVar3._M_node[1]._M_next,(void *)local_290._0_8_,(size_t)p_Var1);
            bVar6 = iVar9 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._0_8_ != &local_280) {
          operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
        }
        this = local_4b8;
        pcVar19 = (cmConditionEvaluator *)0x0;
        if (!bVar6) {
          local_290._0_8_ = &local_280;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"VERSION_GREATER","");
          p_Var1 = iVar3._M_node[1]._M_prev;
          pcVar19 = (cmConditionEvaluator *)0x2;
          if (p_Var1 == (_List_node_base *)local_290._8_8_) {
            if (p_Var1 == (_List_node_base *)0x0) {
              pcVar19 = (cmConditionEvaluator *)0x1;
            }
            else {
              iVar9 = bcmp(iVar3._M_node[1]._M_next,(void *)local_290._0_8_,(size_t)p_Var1);
              pcVar19 = (cmConditionEvaluator *)(ulong)(2 - (iVar9 == 0));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._0_8_ != &local_280) {
            operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
          }
        }
        bVar6 = cmSystemTools::VersionCompare((CompareOp)pcVar19,local_4a8->_M_local_buf,pcVar13);
        HandleBinaryOp(pcVar19,bVar6,&local_4b0,&local_4c0,newArgs,&local_4c8,&local_4d8);
      }
      iVar3._M_node = local_4c8._M_node;
      bVar6 = local_4c8._M_node == (_List_node_base *)newArgs;
      bVar22 = local_4d8._M_node == (_List_node_base *)newArgs;
      if (bVar22 || bVar6) {
        bVar7 = false;
      }
      else {
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"IS_NEWER_THAN","");
        bVar7 = IsKeyword(this,&local_310,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
      }
      if ((!bVar22 && !bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2)) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (bVar7 != false) {
        local_290._0_8_ = local_290._0_8_ & 0xffffffff00000000;
        pcVar19 = (cmConditionEvaluator *)(local_4c0._M_node + 1);
        bVar6 = cmsys::SystemTools::FileTimeCompare
                          ((string *)pcVar19,(string *)(local_4d8._M_node + 1),(int *)local_290);
        HandleBinaryOp(pcVar19,(uint)local_290._0_4_ < 2 || !bVar6,&local_4b0,&local_4c0,newArgs,
                       &local_4c8,&local_4d8);
      }
      iVar3._M_node = local_4c8._M_node;
      if (local_4d8._M_node == (_List_node_base *)newArgs ||
          local_4c8._M_node == (_List_node_base *)newArgs) {
        bVar6 = false;
      }
      else {
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"IN_LIST","");
        bVar6 = IsKeyword(this,&local_330,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar6 != false) {
        if (this->Policy57Status < NEW) {
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_108,(cmPolicies *)0x39,id);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,(char *)local_108,(long)pbStack_100);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
            if (local_108 != (undefined1  [8])local_f8) {
              operator_delete((void *)local_108,(ulong)(local_f8[0]._M_allocated_capacity + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,
                       "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x85);
            pcVar21 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar21,AUTHOR_WARNING,(string *)local_108,false);
            if (local_108 != (undefined1  [8])local_f8) {
              operator_delete((void *)local_108,(ulong)(local_f8[0]._M_allocated_capacity + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
            std::ios_base::~ios_base(local_220);
          }
        }
        else {
          pcVar17 = (cmExpandedCommandArgument *)(local_4c0._M_node + 1);
          local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)GetDefinitionIfUnquoted(this,pcVar17);
          if (local_4a8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar17->Value)._M_dataplus._M_p;
          }
          pcVar21 = this->Makefile;
          pcVar13 = cmMakefile::GetDefinition(pcVar21,(string *)(local_4d8._M_node + 1));
          if (pcVar13 == (char *)0x0) {
            bVar6 = false;
          }
          else {
            local_108 = (undefined1  [8])0x0;
            pbStack_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_f8[0]._M_allocated_capacity = (char *)0x0;
            local_290._0_8_ = &local_280;
            sVar15 = strlen(pcVar13);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_290,pcVar13,pcVar13 + sVar15);
            cmSystemTools::ExpandListArgument
                      ((string *)local_290,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_108,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._0_8_ != &local_280) {
              operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
            }
            _Var16 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                               (local_108,pbStack_100,&local_4a8);
            bVar6 = _Var16._M_current != pbStack_100;
            pcVar21 = (cmMakefile *)local_108;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pcVar21);
          }
          HandleBinaryOp((cmConditionEvaluator *)pcVar21,bVar6,&local_4b0,&local_4c0,newArgs,
                         &local_4c8,&local_4d8);
        }
      }
      bVar5 = local_4a9;
    }
    bVar18 = local_4a9;
  } while (local_4b0 != 0);
LAB_0026f9b3:
  local_4a9 = bVar5;
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0,
                    CONCAT71(local_490._M_allocated_capacity._1_7_,local_490._M_local_buf[0]) + 1);
  }
  return (bool)(bVar18 & 1);
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  std::string def_buf;
  const char *def;
  const char *def2;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        IsKeyword("MATCHES", *argP1))
        {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_"))
          {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
          }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if ( !regEntry.compile(rex) )
          {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
          }
        if (regEntry.find(def))
          {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && this->IsKeyword("MATCHES", *arg))
        {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs,argP1,argP2);
        reducible = 1;
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("LESS", *argP1) ||
         this->IsKeyword("GREATER", *argP1) ||
         this->IsKeyword("EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if(sscanf(def, "%lg", &lhs) != 1 ||
           sscanf(def2, "%lg", &rhs) != 1)
          {
          result = false;
          }
        else if (*(argP1) == "LESS")
          {
          result = (lhs < rhs);
          }
        else if (*(argP1) == "GREATER")
          {
          result = (lhs > rhs);
          }
        else
          {
          result = (lhs == rhs);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("STRLESS", *argP1) ||
         this->IsKeyword("STREQUAL", *argP1) ||
         this->IsKeyword("STRGREATER", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def,def2);
        bool result;
        if (*(argP1) == "STRLESS")
          {
          result = (val < 0);
          }
        else if (*(argP1) == "STRGREATER")
          {
          result = (val > 0);
          }
        else // strequal
          {
          result = (val == 0);
          }
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
        (this->IsKeyword("VERSION_LESS", *argP1) ||
         this->IsKeyword("VERSION_GREATER", *argP1) ||
         this->IsKeyword("VERSION_EQUAL", *argP1)))
        {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op = cmSystemTools::OP_EQUAL;
        if(*argP1 == "VERSION_LESS")
          {
          op = cmSystemTools::OP_LESS;
          }
        else if(*argP1 == "VERSION_GREATER")
          {
          op = cmSystemTools::OP_GREATER;
          }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result,
          reducible, arg, newArgs, argP1, argP2);
        }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IS_NEWER_THAN", *argP1))
        {
        int fileIsNewer=0;
        bool success=cmSystemTools::FileTimeCompare(arg->GetValue(),
            (argP2)->GetValue(),
            &fileIsNewer);
        this->HandleBinaryOp(
          (success==false || fileIsNewer==1 || fileIsNewer==0),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword("IN_LIST", *argP1))
        {
        if(this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN)
          {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if(def2)
            {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
            }

          this->HandleBinaryOp(result,
            reducible, arg, newArgs, argP1, argP2);
          }
          else if(this->Policy57Status == cmPolicies::WARN)
            {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
            e << "IN_LIST will be interpreted as an operator "
              "when the policy is set to NEW.  "
              "Since the policy is not set the OLD behavior will be used.";

            this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
            }
        }

      ++arg;
      }
    }
  while (reducible);
  return true;
}